

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_expr_prefix(CPState *cp,CPValue *k)

{
  int iVar1;
  CTypeID CVar2;
  CPToken CVar3;
  CType *ct_00;
  anon_union_4_2_43a9a9ed_for_CPValue_0 aVar4;
  MSize local_2c;
  CTSize sz;
  CType *ct;
  CTypeID id;
  CPValue *k_local;
  CPState *cp_local;
  
  if (cp->tok == 0x102) {
    *k = cp->val;
    cp_next(cp);
  }
  else {
    iVar1 = cp_opt(cp,0x2b);
    if (iVar1 == 0) {
      iVar1 = cp_opt(cp,0x2d);
      if (iVar1 == 0) {
        iVar1 = cp_opt(cp,0x7e);
        if (iVar1 == 0) {
          iVar1 = cp_opt(cp,0x21);
          if (iVar1 == 0) {
            iVar1 = cp_opt(cp,0x28);
            if (iVar1 == 0) {
              iVar1 = cp_opt(cp,0x2a);
              if (iVar1 == 0) {
                iVar1 = cp_opt(cp,0x26);
                if (iVar1 == 0) {
                  iVar1 = cp_opt(cp,0x12a);
                  if (iVar1 == 0) {
                    iVar1 = cp_opt(cp,299);
                    if (iVar1 == 0) {
                      if (cp->tok == 0x100) {
                        if (cp->ct->info >> 0x1c == 0xb) {
                          k->field_0 = (anon_union_4_2_43a9a9ed_for_CPValue_0)cp->ct->size;
                          k->id = cp->ct->info & 0xffff;
                        }
                        else if (cp->ct->info >> 0x1c == 0xc) {
                          k->field_0 = (anon_union_4_2_43a9a9ed_for_CPValue_0)(cp->val).id;
                          k->id = cp->ct->info & 0xffff;
                        }
                        else {
                          if (cp->ct->info >> 0x1c != 6) goto LAB_0019eb0a;
                          k->field_0 = (anon_union_4_2_43a9a9ed_for_CPValue_0)(cp->val).id;
                          k->id = (cp->val).id;
                        }
                        cp_next(cp);
                      }
                      else {
                        if (cp->tok != 0x101) {
LAB_0019eb0a:
                          cp_errmsg(cp,cp->tok,LJ_ERR_XSYMBOL);
                        }
                        local_2c = cp->str->len;
                        while (CVar3 = cp_next(cp), CVar3 == 0x101) {
                          local_2c = cp->str->len + local_2c;
                        }
                        (k->field_0).i32 = local_2c + 1;
                        k->id = 0x15;
                      }
                    }
                    else {
                      cp_expr_sizeof(cp,k,0);
                    }
                  }
                  else {
                    cp_expr_sizeof(cp,k,1);
                  }
                }
                else {
                  cp_expr_unary(cp,k);
                  CVar2 = lj_ctype_intern(cp->cts,k->id + 0x20030000,8);
                  k->id = CVar2;
                }
              }
              else {
                cp_expr_unary(cp,k);
                ct_00 = lj_ctype_rawref(cp->cts,k->id);
                if (ct_00->info >> 0x1d != 1) {
                  cp_err_badidx(cp,ct_00);
                }
                (k->field_0).i32 = 0;
                k->id = ct_00->info & 0xffff;
              }
            }
            else {
              iVar1 = cp_istypedecl(cp);
              if (iVar1 == 0) {
                cp_expr_comma(cp,k);
                cp_check(cp,0x29);
              }
              else {
                CVar2 = cp_decl_abstract(cp);
                cp_check(cp,0x29);
                cp_expr_unary(cp,k);
                k->id = CVar2;
              }
            }
          }
          else {
            cp_expr_unary(cp,k);
            aVar4.i32._1_3_ = 0;
            aVar4.u32._0_1_ = ((k->field_0).i32 != 0 ^ 0xffU) & 1;
            k->field_0 = aVar4;
            k->id = 9;
          }
        }
        else {
          cp_expr_unary(cp,k);
          (k->field_0).u32 = (k->field_0).u32 ^ 0xffffffff;
        }
      }
      else {
        cp_expr_unary(cp,k);
        (k->field_0).i32 = -(k->field_0).i32;
      }
    }
    else {
      cp_expr_unary(cp,k);
    }
  }
  return;
}

Assistant:

static void cp_expr_prefix(CPState *cp, CPValue *k)
{
  if (cp->tok == CTOK_INTEGER) {
    *k = cp->val; cp_next(cp);
  } else if (cp_opt(cp, '+')) {
    cp_expr_unary(cp, k);  /* Nothing to do (well, integer promotion). */
  } else if (cp_opt(cp, '-')) {
    cp_expr_unary(cp, k); k->i32 = -k->i32;
  } else if (cp_opt(cp, '~')) {
    cp_expr_unary(cp, k); k->i32 = ~k->i32;
  } else if (cp_opt(cp, '!')) {
    cp_expr_unary(cp, k); k->i32 = !k->i32; k->id = CTID_INT32;
  } else if (cp_opt(cp, '(')) {
    if (cp_istypedecl(cp)) {  /* Cast operator. */
      CTypeID id = cp_decl_abstract(cp);
      cp_check(cp, ')');
      cp_expr_unary(cp, k);
      k->id = id;  /* No conversion performed. */
    } else {  /* Sub-expression. */
      cp_expr_comma(cp, k);
      cp_check(cp, ')');
    }
  } else if (cp_opt(cp, '*')) {  /* Indirection. */
    CType *ct;
    cp_expr_unary(cp, k);
    ct = lj_ctype_rawref(cp->cts, k->id);
    if (!ctype_ispointer(ct->info))
      cp_err_badidx(cp, ct);
    k->u32 = 0; k->id = ctype_cid(ct->info);
  } else if (cp_opt(cp, '&')) {  /* Address operator. */
    cp_expr_unary(cp, k);
    k->id = lj_ctype_intern(cp->cts, CTINFO(CT_PTR, CTALIGN_PTR+k->id),
			    CTSIZE_PTR);
  } else if (cp_opt(cp, CTOK_SIZEOF)) {
    cp_expr_sizeof(cp, k, 1);
  } else if (cp_opt(cp, CTOK_ALIGNOF)) {
    cp_expr_sizeof(cp, k, 0);
  } else if (cp->tok == CTOK_IDENT) {
    if (ctype_type(cp->ct->info) == CT_CONSTVAL) {
      k->u32 = cp->ct->size; k->id = ctype_cid(cp->ct->info);
    } else if (ctype_type(cp->ct->info) == CT_EXTERN) {
      k->u32 = cp->val.id; k->id = ctype_cid(cp->ct->info);
    } else if (ctype_type(cp->ct->info) == CT_FUNC) {
      k->u32 = cp->val.id; k->id = cp->val.id;
    } else {
      goto err_expr;
    }
    cp_next(cp);
  } else if (cp->tok == CTOK_STRING) {
    CTSize sz = cp->str->len;
    while (cp_next(cp) == CTOK_STRING)
      sz += cp->str->len;
    k->u32 = sz + 1;
    k->id = CTID_A_CCHAR;
  } else {
  err_expr:
    cp_errmsg(cp, cp->tok, LJ_ERR_XSYMBOL);
  }
}